

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err_local.h
# Opt level: O0

void err_set_debug(ERR_STATE *es,size_t i,char *file,int line,char *fn)

{
  char *pcVar1;
  undefined4 in_ECX;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  char *in_R8;
  
  CRYPTO_free(*(void **)(in_RDI + 0x240 + in_RSI * 8));
  if ((in_RDX == (char *)0x0) || (*in_RDX == '\0')) {
    *(undefined8 *)(in_RDI + 0x240 + in_RSI * 8) = 0;
  }
  else {
    pcVar1 = CRYPTO_strdup(in_RDX,"crypto/err/err_local.h",0x3c);
    *(char **)(in_RDI + 0x240 + in_RSI * 8) = pcVar1;
  }
  *(undefined4 *)(in_RDI + 0x2c0 + in_RSI * 4) = in_ECX;
  CRYPTO_free(*(void **)(in_RDI + 0x300 + in_RSI * 8));
  if ((in_R8 == (char *)0x0) || (*in_R8 == '\0')) {
    *(undefined8 *)(in_RDI + 0x300 + in_RSI * 8) = 0;
  }
  else {
    pcVar1 = CRYPTO_strdup(in_R8,"crypto/err/err_local.h",0x42);
    *(char **)(in_RDI + 0x300 + in_RSI * 8) = pcVar1;
  }
  return;
}

Assistant:

static ossl_inline void err_set_debug(ERR_STATE *es, size_t i,
                                      const char *file, int line,
                                      const char *fn)
{
    /*
     * We dup the file and fn strings because they may be provider owned. If the
     * provider gets unloaded, they may not be valid anymore.
     */
    OPENSSL_free(es->err_file[i]);
    if (file == NULL || file[0] == '\0')
        es->err_file[i] = NULL;
    else
        es->err_file[i] = OPENSSL_strdup(file);
    es->err_line[i] = line;
    OPENSSL_free(es->err_func[i]);
    if (fn == NULL || fn[0] == '\0')
        es->err_func[i] = NULL;
    else
        es->err_func[i] = OPENSSL_strdup(fn);
}